

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsTest.cpp
# Opt level: O2

char getch_mode(int echo)

{
  uint uVar1;
  int iVar2;
  termios tnew;
  termios told;
  
  tcgetattr(0,(termios *)&told);
  tnew.c_iflag = told.c_iflag;
  tnew.c_oflag = told.c_oflag;
  tnew.c_line = told.c_line;
  tnew.c_cc[0] = told.c_cc[0];
  tnew.c_cc[1] = told.c_cc[1];
  tnew.c_cc[2] = told.c_cc[2];
  tnew.c_cc[3] = told.c_cc[3];
  tnew.c_cc[4] = told.c_cc[4];
  tnew.c_cc[5] = told.c_cc[5];
  tnew.c_cc[6] = told.c_cc[6];
  tnew.c_cc[7] = told.c_cc[7];
  tnew.c_cc[8] = told.c_cc[8];
  tnew.c_cc[9] = told.c_cc[9];
  tnew.c_cc[10] = told.c_cc[10];
  tnew.c_cc[0xb] = told.c_cc[0xb];
  tnew.c_cc[0xc] = told.c_cc[0xc];
  tnew.c_cc[0xd] = told.c_cc[0xd];
  tnew.c_cc[0xe] = told.c_cc[0xe];
  tnew.c_cc[0xf] = told.c_cc[0xf];
  tnew.c_cc[0x10] = told.c_cc[0x10];
  tnew.c_cc[0x11] = told.c_cc[0x11];
  tnew.c_cc[0x12] = told.c_cc[0x12];
  tnew.c_cc[0x13] = told.c_cc[0x13];
  tnew.c_cc[0x14] = told.c_cc[0x14];
  tnew.c_cc[0x15] = told.c_cc[0x15];
  tnew.c_cc[0x16] = told.c_cc[0x16];
  uVar1 = 8;
  if (echo == 0) {
    uVar1 = 0xfffffff5;
  }
  tnew.c_ispeed = told.c_ispeed;
  tnew.c_ospeed = told.c_ospeed;
  tnew.c_lflag = told.c_lflag;
  tnew.c_cflag = told.c_cflag;
  tnew.c_lflag = tnew.c_lflag & uVar1;
  tcsetattr(0,0,(termios *)&tnew);
  iVar2 = getchar();
  tcsetattr(0,0,(termios *)&told);
  return (char)iVar2;
}

Assistant:

static char getch_mode(int echo)
{
	struct termios told, tnew;
	char ch;
	initTermios(echo, &told, &tnew);
	ch = getchar();
	resetTermios(&told);
	return ch;
}